

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O2

void __thiscall
antlr::ASTFactory::registerFactory(ASTFactory *this,int type,char *ast_name,factory_type factory)

{
  pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()> *ppVar1;
  ANTLRException *pAVar2;
  pointer pppVar3;
  allocator<char> local_51;
  string local_50;
  
  if (type < 4) {
    pAVar2 = (ANTLRException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Internal parser error invalid type passed to RegisterFactory",
               &local_51);
    ANTLRException::ANTLRException(pAVar2,&local_50);
    __cxa_throw(pAVar2,&ANTLRException::typeinfo,ANTLRException::~ANTLRException);
  }
  if (factory != (factory_type)0x0) {
    pppVar3 = (this->nodeFactories).
              super__Vector_base<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->nodeFactories).
                      super__Vector_base<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pppVar3 >> 3) <
        (ulong)(type + 1U)) {
      local_50._M_dataplus._M_p = (pointer)&this->default_factory_descriptor;
      std::
      vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
      ::resize(&this->nodeFactories,(long)(int)(type + 1U),(value_type *)&local_50);
      pppVar3 = (this->nodeFactories).
                super__Vector_base<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    ppVar1 = (pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()> *)operator_new(0x10);
    ppVar1->first = ast_name;
    ppVar1->second = (_func_ASTRefCount<antlr::AST> *)factory;
    pppVar3[(uint)type] = ppVar1;
    return;
  }
  pAVar2 = (ANTLRException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Internal parser error 0 factory passed to RegisterFactory",
             &local_51);
  ANTLRException::ANTLRException(pAVar2,&local_50);
  __cxa_throw(pAVar2,&ANTLRException::typeinfo,ANTLRException::~ANTLRException);
}

Assistant:

void ASTFactory::registerFactory( int type, const char* ast_name, factory_type factory )
{
	// check validity of arguments...
	if( type < Token::MIN_USER_TYPE )
		throw ANTLRException("Internal parser error invalid type passed to RegisterFactory");
	if( factory == 0 )
		throw ANTLRException("Internal parser error 0 factory passed to RegisterFactory");

	// resize up to and including 'type' and initalize any gaps to default
	// factory.
	if( nodeFactories.size() < (static_cast<unsigned int>(type)+1) )
		nodeFactories.resize( type+1, &default_factory_descriptor );

	// And add new thing..
	nodeFactories[type] = new ANTLR_USE_NAMESPACE(std)pair<const char*, factory_type>( ast_name, factory );
}